

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

void prvTidyAddCharToLexer(Lexer *lexer,uint c)

{
  int iVar1;
  tmbchar local_2a [8];
  tmbchar buf [10];
  int count;
  int err;
  int i;
  uint c_local;
  Lexer *lexer_local;
  
  buf[2] = '\0';
  buf[3] = '\0';
  buf[4] = '\0';
  buf[5] = '\0';
  memset(local_2a,0,10);
  iVar1 = prvTidyEncodeCharToUTF8Bytes(c,local_2a,(TidyOutputSink *)0x0,(int *)(buf + 2));
  buf[6] = (char)iVar1;
  buf[7] = (char)((uint)iVar1 >> 8);
  buf[8] = (char)((uint)iVar1 >> 0x10);
  buf[9] = (char)((uint)iVar1 >> 0x18);
  if (iVar1 != 0) {
    local_2a[0] = -0x11;
    local_2a[1] = 0xbf;
    local_2a[2] = 0xbd;
    buf[2] = '\x03';
    buf[3] = '\0';
    buf[4] = '\0';
    buf[5] = '\0';
  }
  for (count = 0; count < (int)buf._2_4_; count = count + 1) {
    AddByte(lexer,local_2a[count]);
  }
  return;
}

Assistant:

void TY_(AddCharToLexer)( Lexer *lexer, uint c )
{
    int i, err, count = 0;
    tmbchar buf[10] = {0};
    
    err = TY_(EncodeCharToUTF8Bytes)( c, buf, NULL, &count );
    if (err)
    {
#if 0 && defined(_DEBUG)
        fprintf( stderr, "lexer UTF-8 encoding error for U+%x : ", c );
#endif
        /* replacement character 0xFFFD encoded as UTF-8 */
        buf[0] = (byte) 0xEF;
        buf[1] = (byte) 0xBF;
        buf[2] = (byte) 0xBD;
        count = 3;
    }
    
    for ( i = 0; i < count; ++i )
        AddByte( lexer, buf[i] );
}